

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

Matrix33 *
AML::eulerAngles2DCM_ZXZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double data [3] [3];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = cos(psi);
  local_28 = sin(psi);
  local_58 = dVar1 * dVar5 - local_28 * dVar2 * dVar3;
  local_50 = dVar1 * local_28 + dVar2 * dVar3 * dVar5;
  local_48 = dVar2 * dVar4;
  local_40 = -dVar2 * dVar5 - local_28 * dVar1 * dVar3;
  local_38 = dVar1 * dVar3 * dVar5 - dVar2 * local_28;
  local_30 = dVar1 * dVar4;
  local_28 = local_28 * dVar4;
  local_20 = -dVar4 * dVar5;
  local_18 = dVar3;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngles2DCM_ZXZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);

        double data[3][3];
        data[0][0] = cosPhi * cosPsi - sinPhi * cosTheta * sinPsi;
        data[0][1] = cosPhi * sinPsi + sinPhi * cosTheta * cosPsi;
        data[0][2] = sinPhi * sinTheta;
        data[1][0] = -sinPhi * cosPsi - cosPhi * cosTheta * sinPsi;
        data[1][1] = -sinPhi * sinPsi + cosPhi * cosTheta * cosPsi;
        data[1][2] = cosPhi * sinTheta;
        data[2][0] = sinTheta * sinPsi;
        data[2][1] = -sinTheta * cosPsi;
        data[2][2] = cosTheta;
        return Matrix33(data);
    }